

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O2

void cJSON_AddItemToObject(cJSON *object,char *string,cJSON *item)

{
  char *pcVar1;
  
  if (item != (cJSON *)0x0) {
    if (item->string != (char *)0x0) {
      (*cJSON_free)(item->string);
    }
    pcVar1 = cJSON_strdup(string);
    item->string = pcVar1;
    cJSON_AddItemToArray(object,item);
    return;
  }
  return;
}

Assistant:

void   cJSON_AddItemToObject(cJSON *object,const char *string,cJSON *item)	{if (!item) return; if (item->string) cJSON_free(item->string);item->string=cJSON_strdup(string);cJSON_AddItemToArray(object,item);}